

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_signal_handler_setup(void)

{
  int iVar1;
  _union_1457 local_a0;
  sigaction act;
  
  iVar1 = fio_trylock(&fio_signal_set_flag);
  if (iVar1 == 0) {
    memset(&local_a0,0,0x98);
    local_a0.sa_handler = sig_int_handler;
    sigemptyset((sigset_t *)&act);
    act.sa_mask.__val[0xf]._0_4_ = 0x10000001;
    iVar1 = sigaction(2,(sigaction *)&local_a0,(sigaction *)&fio_old_sig_int);
    if (iVar1 == 0) {
      iVar1 = sigaction(0xf,(sigaction *)&local_a0,(sigaction *)&fio_old_sig_term);
      if (iVar1 == 0) {
        iVar1 = sigaction(10,(sigaction *)&local_a0,(sigaction *)&fio_old_sig_usr1);
        if (iVar1 == 0) {
          local_a0 = (_union_1457)0x1;
          iVar1 = sigaction(0xd,(sigaction *)&local_a0,(sigaction *)&fio_old_sig_pipe);
          if (iVar1 != 0) {
            perror("couldn\'t set signal handler");
          }
        }
        else {
          perror("couldn\'t set signal handler");
        }
      }
      else {
        perror("couldn\'t set signal handler");
      }
    }
    else {
      perror("couldn\'t set signal handler");
    }
  }
  return;
}

Assistant:

static void fio_signal_handler_setup(void) {
  /* setup signal handling */
  struct sigaction act;
  if (fio_trylock(&fio_signal_set_flag))
    return;

  memset(&act, 0, sizeof(act));

  act.sa_handler = sig_int_handler;
  sigemptyset(&act.sa_mask);
  act.sa_flags = SA_RESTART | SA_NOCLDSTOP;

  if (sigaction(SIGINT, &act, &fio_old_sig_int)) {
    perror("couldn't set signal handler");
    return;
  };

  if (sigaction(SIGTERM, &act, &fio_old_sig_term)) {
    perror("couldn't set signal handler");
    return;
  };
#if !FIO_DISABLE_HOT_RESTART
  if (sigaction(SIGUSR1, &act, &fio_old_sig_usr1)) {
    perror("couldn't set signal handler");
    return;
  };
#endif

  act.sa_handler = SIG_IGN;
  if (sigaction(SIGPIPE, &act, &fio_old_sig_pipe)) {
    perror("couldn't set signal handler");
    return;
  };
}